

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::torrent::add_extension(torrent *this,shared_ptr<libtorrent::torrent_plugin> *ext)

{
  _Atomic_word *p_Var1;
  size_t *psVar2;
  pointer pppVar3;
  peer_connection *this_00;
  element_type *peVar4;
  int iVar5;
  _Node *p_Var6;
  pointer pppVar7;
  shared_ptr<libtorrent::peer_plugin> pp;
  element_type *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  shared_ptr<libtorrent::peer_plugin> local_68;
  undefined8 local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  undefined8 local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  torrent *local_38;
  
  p_Var6 = ::std::__cxx11::
           list<std::shared_ptr<libtorrent::torrent_plugin>,std::allocator<std::shared_ptr<libtorrent::torrent_plugin>>>
           ::_M_create_node<std::shared_ptr<libtorrent::torrent_plugin>const&>
                     ((list<std::shared_ptr<libtorrent::torrent_plugin>,std::allocator<std::shared_ptr<libtorrent::torrent_plugin>>>
                       *)&this->m_extensions,ext);
  ::std::__detail::_List_node_base::_M_hook(&p_Var6->super__List_node_base);
  psVar2 = &(this->m_extensions).
            super__List_base<std::shared_ptr<libtorrent::torrent_plugin>,_std::allocator<std::shared_ptr<libtorrent::torrent_plugin>_>_>
            ._M_impl._M_node._M_size;
  *psVar2 = *psVar2 + 1;
  pppVar3 = (this->super_torrent_hot_members).m_connections.
            super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            .
            super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_38 = this;
  for (pppVar7 = (this->super_torrent_hot_members).m_connections.
                 super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                 .
                 super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; pppVar7 != pppVar3;
      pppVar7 = pppVar7 + 1) {
    this_00 = *pppVar7;
    peVar4 = (ext->super___shared_ptr<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    ::std::__shared_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<libtorrent::aux::peer_connection,void>
              ((__shared_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2> *)
               &local_58,
               (__weak_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2> *)
               &this_00->super_enable_shared_from_this<libtorrent::aux::peer_connection>);
    if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_50->_M_weak_count = local_50->_M_weak_count + 1;
        UNLOCK();
      }
      else {
        local_50->_M_weak_count = local_50->_M_weak_count + 1;
      }
    }
    local_48 = local_58;
    local_40 = local_50;
    (*peVar4->_vptr_torrent_plugin[2])(&local_78,peVar4,&local_48);
    if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &local_40->_M_weak_count;
        iVar5 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar5 = local_40->_M_weak_count;
        local_40->_M_weak_count = iVar5 + -1;
      }
      if (iVar5 == 1) {
        (*local_40->_vptr__Sp_counted_base[3])();
      }
    }
    if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
    }
    if (local_78 != (element_type *)0x0) {
      local_68.super___shared_ptr<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_78;
      local_68.super___shared_ptr<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = p_Stack_70;
      local_78 = (element_type *)0x0;
      p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      peer_connection::add_extension(this_00,&local_68);
      if (local_68.super___shared_ptr<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_68.super___shared_ptr<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    if (p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
    }
  }
  if (((local_38->super_torrent_hot_members).field_0x4b & 2) != 0) {
    (*((ext->super___shared_ptr<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
      _vptr_torrent_plugin[8])();
  }
  return;
}

Assistant:

void torrent::add_extension(std::shared_ptr<torrent_plugin> ext)
	{
		m_extensions.push_back(ext);

		for (auto* p : m_connections)
		{
			TORRENT_INCREMENT(m_iterating_connections);
			std::shared_ptr<peer_plugin> pp(ext->new_connection(peer_connection_handle(p->self())));
			if (pp) p->add_extension(std::move(pp));
		}

		// if files are checked for this torrent, call the extension
		// to let it initialize itself
		if (m_connections_initialized)
			ext->on_files_checked();
	}